

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

string * __thiscall cppnet::Address::ToIpv6(string *__return_storage_ptr__,Address *this,string *ip)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::find((char)ip,0x3a);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar2 == -1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"::FFFF:","");
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(ip->_M_dataplus)._M_p);
  }
  else {
    pcVar1 = (ip->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + ip->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToIpv6(const std::string& ip) {
    if (!IsIpv4(ip)) {
        return ip;
    }
    
    std::string ret("::FFFF:");
    ret.append(ip);
    return ret;
}